

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void StdStringStreamWithRewind<unsigned_short>(void)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  char *__s;
  unsigned_short i;
  long lVar5;
  stringstream local_1d0 [8];
  stringstream ss;
  undefined1 local_1c0 [8];
  string local_1b8 [104];
  ios_base local_150 [264];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,'@');
  std::__cxx11::stringbuf::str(local_1b8);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  __s = _endl<char,std::char_traits<char>> + (*_endl<char,std::char_traits<char>> == '*');
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"std::stringstream with rewind",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  lVar2 = std::chrono::_V2::steady_clock::now();
  lVar5 = 0;
  do {
    std::ostream::seekp(local_1c0,0,0);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xffff);
  lVar3 = std::chrono::_V2::steady_clock::now();
  lVar5 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar5 + -0x18)) = 3;
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::ios_base::~ios_base(local_150);
  return;
}

Assistant:

void StdStringStreamWithRewind()
{
    std::stringstream ss;
    ss.str(std::string(64, '0'));
    PROFILING_BEGIN(T, "std::stringstream with rewind")
    ss.seekp(0);
    ss << i;
    PROFILING_END()
}